

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

int __thiscall
UnifiedRegex::DefineGroupFixedInst::Print
          (DefineGroupFixedInst *this,DebugWriter *w,Label label,Char *litbuf)

{
  Char *litbuf_local;
  Label label_local;
  DebugWriter *w_local;
  DefineGroupFixedInst *this_local;
  
  DebugWriter::Print(w,L"L%04x: ",(ulong)label);
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Print(w,L"(0x%03x bytes) ",10);
  }
  DebugWriter::Print(w,L"DefineGroupFixed");
  DebugWriter::Print(w,L"(");
  GroupMixin::Print(&this->super_GroupMixin,w,litbuf);
  DebugWriter::Print(w,L", ");
  FixedLengthMixin::Print(&this->super_FixedLengthMixin,w,litbuf);
  DebugWriter::Print(w,L", ");
  NoNeedToSaveMixin::Print(&this->super_NoNeedToSaveMixin,w,litbuf);
  DebugWriter::PrintEOL(w,L")");
  if ((DAT_01ec73dd & 1) != 0) {
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>
              (&this->super_Inst,w,&this->super_Inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::GroupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_GroupMixin,L"GroupMixin");
    Inst::PrintBytes<UnifiedRegex::FixedLengthMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_FixedLengthMixin,
               L"FixedLengthMixin");
    Inst::PrintBytes<UnifiedRegex::NoNeedToSaveMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_NoNeedToSaveMixin,
               L"NoNeedToSaveMixin");
    DebugWriter::Unindent(w);
  }
  return 10;
}

Assistant:

int DefineGroupFixedInst::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        PRINT_RE_BYTECODE_BEGIN("DefineGroupFixed");
        PRINT_MIXIN_COMMA(GroupMixin);
        PRINT_MIXIN_COMMA(FixedLengthMixin);
        PRINT_MIXIN(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(GroupMixin);
        PRINT_BYTES(FixedLengthMixin);
        PRINT_BYTES(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_END();
    }